

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O0

void __thiscall L10_2::Stock::acquire(Stock *this,string *co,long n,double pr)

{
  ostream *poVar1;
  double pr_local;
  long n_local;
  string *co_local;
  Stock *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)co);
  if (n < 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Number of shares can\'t be negative; ");
    poVar1 = std::operator<<(poVar1,(string *)this);
    std::operator<<(poVar1," shares set to 0.\n");
    this->shares = 0;
  }
  else {
    this->shares = n;
  }
  this->share_val = pr;
  set_tot(this);
  return;
}

Assistant:

void L10_2::Stock::acquire(const std::string &co, long n, double pr) {
    company = co;
    if (n < 0) {
        std::cout << "Number of shares can't be negative; " << company << " shares set to 0.\n";
        shares= 0 ;
    } else {
        shares = n;
    }
    share_val = pr;
    //  设置 total 值
    set_tot();
}